

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v2.cc
# Opt level: O0

int __thiscall
lf::io::(anonymous_namespace)::detail1::numNodesAdapted_impl_1::operator()
          (numNodesAdapted_impl_1 *this,ElementType *a0)

{
  size_type_conflict sVar1;
  ElementType *a0_local;
  numNodesAdapted_impl_1 *this_local;
  
  sVar1 = NumNodes(*a0);
  return sVar1;
}

Assistant:

BOOST_PHOENIX_ADAPT_FUNCTION(int, numNodesAdapted, NumNodes, 1);

/// Defines the Grammar of a msh file using boost::spirit
template <class ITERATOR>
struct MshGrammarText
    : qi::grammar<ITERATOR, boost::fusion::adapted::MshFileAdapted(),
                  ascii::space_type> {
  MshGrammarText(
      qi::rule<ITERATOR, std::pair<size_type, Eigen::Vector3d>()> nodeRule,
      qi::rule<ITERATOR, std::vector<GMshFileV2::Element>(),
               qi::locals<size_type, int, int, int, size_type>>
          elementGroup)
      : MshGrammarText::base_type(start_, "Msh File"),
        node_(nodeRule),
        elementGroup_(elementGroup) {
    using phoenix::push_back;
    using phoenix::reserve;
    using phoenix::val;
    using qi::_val;
    using qi::char_;
    using qi::double_;
    using qi::eps;
    using qi::int_;
    using qi::lexeme;
    using qi::lit;
    using qi::omit;
    using qi::repeat;
    using qi::labels::_1;
    using qi::labels::_2;
    using qi::labels::_3;
    using qi::labels::_4;
    using qi::labels::_a;

    // General Parsers:
    quotedString_ %= lexeme['"' >> +(char_ - '"') >> '"'];
    quotedString_.name("string");
    startComment_ %= !lit("$PhysicalNames") >> !lit("$Nodes") >>
                     !lit("$Elements") >> !lit("$Periodic") >>
                     (lit('$') >> (+(char_ - qi::eol)));
    startComment_.name("Start of Comment");
    comment_ %=
        startComment_[_a = qi::_1] > *(char_ - '$') >> "$End" >> qi::string(_a);
    comment_.name("comment");
    qi::on_error<qi::fail>(comment_,
                           errorHandler_(qi::_1, qi::_2, qi::_3, qi::_4));

    // Physical Entities:
    physicalEntity_ %= int_ > int_ > quotedString_;  // NOLINT
    physicalEntity_.name("Physical Entity Entry");
    qi::on_error<qi::fail>(physicalEntity_,
                           errorHandler_(qi::_1, qi::_2, qi::_3, qi::_4));
    physicalEntityGroup_ %= "$PhysicalNames" >
                            omit[int_[(reserve(_val, qi::_1), _a = qi::_1)]] >
                            repeat(_a)[physicalEntity_] > "$EndPhysicalNames";
    physicalEntityGroup_.name("$Physical Entity Section");
    qi::on_error<qi::fail>(physicalEntityGroup_,
                           errorHandler_(qi::_1, qi::_2, qi::_3, qi::_4));

    // Nodes:
    nodeGroup_ %= "$Nodes" > qi::eol >
                  omit[qi::uint_[(reserve(_val, qi::_1), _a = qi::_1)]] >
                  qi::eol > repeat(_a)[node_] > -qi::eol > "$EndNodes";
    nodeGroup_.name("$Node Section");
    qi::on_error<qi::fail>(node_,
                           errorHandler_(qi::_1, qi::_2, qi::_3, qi::_4));
    qi::on_error<qi::fail>(nodeGroup_,
                           errorHandler_(qi::_1, qi::_2, qi::_3, qi::_4));

    // Elements:
    qi::on_error<qi::fail>(elementGroup_,
                           errorHandler_(qi::_1, qi::_2, qi::_3, qi::_4));

    // Periodic entities:
    periodicEntityNodeMapping_ =
        omit[qi::uint_[(reserve(_val, qi::_1), _a = qi::_1)]] >
        repeat(_a)[qi::uint_ > qi::uint_];  // NOLINT
    periodicEntityNodeMapping_.name("slave-master node mapping");
    qi::on_error<qi::fail>(periodicEntityNodeMapping_,
                           errorHandler_(qi::_1, qi::_2, qi::_3, qi::_4));
    periodicEntity_ =
        int_ > int_ > int_ > periodicEntityNodeMapping_;  // NOLINT
    periodicEntity_.name("periodic entity");
    qi::on_error<qi::fail>(periodicEntity_,
                           errorHandler_(qi::_1, qi::_2, qi::_3, qi::_4));
    periodicEntityGroup_ =
        "$Periodic" > omit[qi::uint_[(reserve(_val, qi::_1), _a = qi::_1)]] >
        repeat(_a)[periodicEntity_] > "$EndPeriodic";
    periodicEntityGroup_.name("periodic entity section");
    qi::on_error<qi::fail>(periodicEntityGroup_,
                           errorHandler_(qi::_1, qi::_2, qi::_3, qi::_4));

    // The whole file:
    start_ %= *comment_ >> -(physicalEntityGroup_ >> *comment_) >> nodeGroup_ >>
              *comment_ >> elementGroup_ >> *comment_ >>
              -(periodicEntityGroup_ >> *comment_);
    start_.name("beginning of file");
    qi::on_error<qi::fail>(start_,
                           errorHandler_(qi::_1, qi::_2, qi::_3, qi::_4));
  }